

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeUpper
          (SPxLPBase<double> *this,VectorBase<double> *newUpper,bool scale)

{
  int iVar1;
  double *pdVar2;
  byte in_DL;
  VectorBase<double> *in_RSI;
  long in_RDI;
  double dVar3;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  LPColSetBase<double> *this_00;
  int local_18;
  
  if ((in_DL & 1) == 0) {
    LPColSetBase<double>::upper_w((LPColSetBase<double> *)(in_RDI + 200));
    VectorBase<double>::operator=(in_stack_ffffffffffffffc0,in_RSI);
  }
  else {
    local_18 = 0;
    while( true ) {
      upper((SPxLPBase<double> *)0x260445);
      iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x26044d);
      if (iVar1 <= local_18) break;
      this_00 = *(LPColSetBase<double> **)(in_RDI + 0x1a8);
      pdVar2 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)this_00,
                          (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      dVar3 = (double)(*(code *)(((_Vector_impl *)
                                 &(this_00->super_SVSetBase<double>).
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)->
                                super__Vector_impl_data)._M_start[0x2c])
                                (*pdVar2,this_00,in_RDI,local_18);
      pdVar2 = LPColSetBase<double>::upper_w
                         (this_00,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      *pdVar2 = dVar3;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

virtual void changeUpper(const VectorBase<R>& newUpper, bool scale = false)
   {
      assert(upper().dim() == newUpper.dim());

      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);

         for(int i = 0; i < upper().dim(); i++)
            LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper[i]);
      }
      else
         LPColSetBase<R>::upper_w() = newUpper;

      assert(isConsistent());
   }